

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O1

void __thiscall senjo::UCIAdapter::TestCommand(UCIAdapter *this,char *params)

{
  byte *pbVar1;
  char cVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  BackgroundCommand *this_00;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  Output OStack_58;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  this_00 = (BackgroundCommand *)operator_new(0x50);
  this_00->engine = this->engine;
  this_00->_vptr_BackgroundCommand = (_func_int **)&PTR__TestCommandHandle_0015cc80;
  this_00[3]._vptr_BackgroundCommand = (_func_int **)(this_00 + 4);
  this_00[3].engine = (ChessEngine *)0x0;
  *(undefined1 *)&this_00[4]._vptr_BackgroundCommand = 0;
  sVar3 = DAT_001b17b8;
  if ((params != (char *)0x0) && (*params != '\0')) {
    if (DAT_001b17b8 == 0) {
      bVar4 = false;
    }
    else {
      iVar5 = strncmp(params,token::Help_abi_cxx11_,DAT_001b17b8);
      if (iVar5 == 0) {
        pcVar7 = params + sVar3;
        cVar2 = params[sVar3];
        uVar6 = (uint)cVar2;
        if (uVar6 != 0) {
          iVar5 = isspace(uVar6);
          bVar8 = iVar5 == 0;
          bVar4 = !bVar8;
          if (!bVar8) {
            params = pcVar7;
          }
          if (bVar8 || cVar2 == '\0') goto LAB_0013f044;
          do {
            iVar5 = isspace((int)(char)uVar6);
            if (iVar5 == 0) break;
            pbVar1 = (byte *)(pcVar7 + 1);
            uVar6 = (uint)*pbVar1;
            pcVar7 = pcVar7 + 1;
          } while (*pbVar1 != 0);
        }
        params = pcVar7;
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
    }
LAB_0013f044:
    if (!bVar4) {
      bVar4 = BackgroundCommand::ParseAndExecute(this_00,params,&this->thread);
      if (bVar4) {
        return;
      }
      goto LAB_0013f0f8;
    }
  }
  Output::Output(&OStack_58,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
  (*this_00->_vptr_BackgroundCommand[3])(&local_50,this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  Output::~Output(&OStack_58);
  Output::Output(&OStack_58,InfoPrefix);
  (*this_00->_vptr_BackgroundCommand[4])(&local_50,this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  Output::~Output(&OStack_58);
LAB_0013f0f8:
  (*this_00->_vptr_BackgroundCommand[1])(this_00);
  return;
}

Assistant:

void UCIAdapter::TestCommand(const char* params)
{
  TestCommandHandle* handle = new TestCommandHandle(engine);
  if (!handle) {
    Output() << "Out of memory";
    return;
  }

  if (!params || !*params || ParamMatch(token::Help, params)) {
    Output() << "usage: " << handle->Usage();
    Output() << handle->Description();
  }
  else if (handle->ParseAndExecute(params, thread)) {
    return;
  }

  delete handle;
  handle = NULL;
}